

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_plt_tri_zone(REF_GRID ref_grid,REF_INT id,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  double dVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *pFVar2;
  REF_INT cell_id;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_00000014;
  undefined8 uVar7;
  long lVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double maxdata;
  double mindata;
  REF_GLOB *l2c;
  double tempdata;
  int dataformat;
  int connsharing;
  int varsharing;
  int passive;
  float zonemarker;
  REF_GLOB nnode;
  REF_LONG ncell;
  double local_b0;
  double local_a8;
  FILE *local_a0;
  REF_GLOB *local_98;
  ulong local_90;
  double local_88;
  int local_80;
  REF_INT local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  ulong local_68;
  double *local_60;
  long local_58;
  long local_50;
  ulong local_48;
  double *local_40;
  REF_CELL local_38;
  
  local_90 = CONCAT44(in_register_00000014,ldim);
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  local_6c = 0x43958000;
  local_80 = 2;
  local_70 = 0;
  local_74 = 0;
  local_78 = 0xffffffff;
  local_60 = scalar;
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"plt tri start");
  }
  uVar3 = ref_grid_compact_cell_id_nodes(ref_grid,ref_cell,id,&local_58,&local_50,&local_98);
  if (uVar3 == 0) {
    local_38 = ref_cell;
    if ((local_58 < 1) || (local_50 < 1)) {
LAB_00149edf:
      if (local_98 == (REF_GLOB *)0x0) {
        return 0;
      }
      free(local_98);
      return 0;
    }
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"plt tri compact");
    }
    local_a0 = (FILE *)file;
    if (ref_mpi->id == 0) {
      sVar4 = fwrite(&local_6c,4,1,(FILE *)file);
      if (sVar4 != 1) {
        pcVar12 = "zonemarker";
        uVar7 = 0xf43;
LAB_00149f52:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar7,"ref_gather_plt_tri_zone",pcVar12,1,sVar4);
        return 1;
      }
      if (-3 < (int)local_90) {
        iVar10 = 0;
        if (0 < (int)local_90 + 2) {
          iVar10 = (int)local_90 + 2;
        }
        iVar10 = iVar10 + 1;
        do {
          sVar4 = fwrite(&local_80,4,1,local_a0);
          if (sVar4 != 1) {
            pcVar12 = "int";
            uVar7 = 0xf46;
            goto LAB_00149f52;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      pFVar2 = local_a0;
      sVar4 = fwrite(&local_70,4,1,local_a0);
      if (sVar4 != 1) {
        pcVar12 = "int";
        uVar7 = 0xf49;
        goto LAB_00149f52;
      }
      sVar4 = fwrite(&local_74,4,1,pFVar2);
      if (sVar4 != 1) {
        pcVar12 = "int";
        uVar7 = 0xf4a;
        goto LAB_00149f52;
      }
      sVar4 = fwrite(&local_78,4,1,pFVar2);
      if (sVar4 != 1) {
        pcVar12 = "int";
        uVar7 = 0xf4b;
        goto LAB_00149f52;
      }
    }
    local_7c = id;
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"plt tri header");
    }
    lVar15 = 0;
    lVar14 = 0;
    do {
      local_a8 = 1e+200;
      local_b0 = -1e+200;
      local_88 = 1e+200;
      if (0 < (long)ref_node->max) {
        lVar11 = 0;
        local_88 = 1e+200;
        dVar16 = -1e+200;
        lVar8 = lVar15;
        do {
          if ((local_98[lVar11] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar11])) {
            dVar1 = *(double *)((long)ref_node->real + lVar8);
            if (dVar1 <= local_88) {
              local_88 = dVar1;
            }
            dVar1 = *(double *)((long)ref_node->real + lVar8);
            local_b0 = dVar16;
            local_a8 = local_88;
            if (dVar16 <= dVar1) {
              dVar16 = dVar1;
              local_b0 = dVar1;
            }
          }
          lVar11 = lVar11 + 1;
          lVar8 = lVar8 + 0x78;
        } while (ref_node->max != lVar11);
      }
      uVar3 = ref_mpi_min(ref_mpi,&local_88,&local_a8,3);
      if (uVar3 != 0) {
        pcVar12 = "mpi min";
        uVar7 = 0xf5a;
        goto LAB_001497f5;
      }
      local_88 = local_b0;
      uVar3 = ref_mpi_max(ref_mpi,&local_88,&local_b0,3);
      pFVar2 = local_a0;
      if (uVar3 != 0) {
        pcVar12 = "mpi max";
        uVar7 = 0xf5c;
        goto LAB_001497f5;
      }
      if (ref_mpi->id == 0) {
        sVar4 = fwrite(&local_a8,8,1,local_a0);
        if (sVar4 != 1) {
          pcVar12 = "mindata";
          uVar7 = 0xf5e;
          goto LAB_00149f52;
        }
        sVar4 = fwrite(&local_b0,8,1,pFVar2);
        if (sVar4 != 1) {
          pcVar12 = "maxdata";
          uVar7 = 0xf5f;
          goto LAB_00149f52;
        }
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 8;
    } while (lVar14 != 3);
    if (0 < (int)local_90) {
      uVar5 = local_90 & 0xffffffff;
      uVar6 = 0;
      pdVar13 = local_60;
      local_48 = uVar5;
      do {
        local_a8 = 1e+200;
        local_b0 = -1e+200;
        local_88 = 1e+200;
        if (0 < (long)ref_node->max) {
          lVar14 = 0;
          local_88 = 1e+200;
          dVar16 = -1e+200;
          pdVar9 = pdVar13;
          do {
            if ((local_98[lVar14] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar14])) {
              dVar1 = *pdVar9;
              if (dVar1 <= local_88) {
                local_88 = dVar1;
              }
              local_b0 = dVar16;
              local_a8 = local_88;
              if (dVar16 <= dVar1) {
                dVar16 = dVar1;
                local_b0 = dVar1;
              }
            }
            lVar14 = lVar14 + 1;
            pdVar9 = pdVar9 + uVar5;
          } while (ref_node->max != lVar14);
        }
        local_68 = uVar6;
        local_40 = pdVar13;
        uVar3 = ref_mpi_min(ref_mpi,&local_88,&local_a8,3);
        if (uVar3 != 0) {
          pcVar12 = "mpi min";
          uVar7 = 0xf6c;
          goto LAB_001497f5;
        }
        local_88 = local_b0;
        uVar3 = ref_mpi_max(ref_mpi,&local_88,&local_b0,3);
        pFVar2 = local_a0;
        if (uVar3 != 0) {
          pcVar12 = "mpi max";
          uVar7 = 0xf6e;
          goto LAB_001497f5;
        }
        if (ref_mpi->id == 0) {
          sVar4 = fwrite(&local_a8,8,1,local_a0);
          if (sVar4 != 1) {
            pcVar12 = "mindata";
            uVar7 = 0xf70;
            goto LAB_00149f52;
          }
          sVar4 = fwrite(&local_b0,8,1,pFVar2);
          if (sVar4 != 1) {
            pcVar12 = "maxdata";
            uVar7 = 0xf71;
            goto LAB_00149f52;
          }
        }
        uVar6 = local_68 + 1;
        pdVar13 = local_40 + 1;
      } while (uVar6 != local_48);
    }
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"plt tri minmax");
    }
    uVar3 = ref_gather_node_tec_block
                      (ref_node,local_58,local_98,(REF_INT)local_90,local_60,local_80,
                       (FILE *)local_a0);
    cell_id = local_7c;
    if (uVar3 == 0) {
      if (1 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"plt tri node");
      }
      uVar3 = ref_gather_cell_id_tec(ref_node,local_38,cell_id,local_50,local_98,1,(FILE *)local_a0)
      ;
      if (uVar3 == 0) {
        if (1 < ref_mpi->timing) {
          ref_mpi_stopwatch_stop(ref_mpi,"plt tri cell");
        }
        goto LAB_00149edf;
      }
      pcVar12 = "c2n";
      uVar7 = 0xf7f;
    }
    else {
      pcVar12 = "block points";
      uVar7 = 0xf79;
    }
  }
  else {
    pcVar12 = "l2c";
    uVar7 = 0xf3a;
  }
LAB_001497f5:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar7,
         "ref_gather_plt_tri_zone",(ulong)uVar3,pcVar12);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_tri_zone(REF_GRID ref_grid, REF_INT id,
                                                  REF_INT ldim, REF_DBL *scalar,
                                                  FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  float zonemarker = 299.0;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int dataformat = 2; /*1=Float, 2=Double*/
  int passive = 0;
  int varsharing = 0;
  int connsharing = -1;
  double mindata, maxdata, tempdata;
  REF_INT node, ixyz, i;

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tri start");

  RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, id, &nnode, &ncell,
                                     &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tri compact");

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    for (i = 0; i < 3 + ldim; i++) {
      REIS(1, fwrite(&dataformat, sizeof(int), 1, file), "int");
    }

    REIS(1, fwrite(&passive, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varsharing, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&connsharing, sizeof(int), 1, file), "int");
  }
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tri header");

  for (ixyz = 0; ixyz < 3; ixyz++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, ref_node_xyz(ref_node, ixyz, node));
        maxdata = MAX(maxdata, ref_node_xyz(ref_node, ixyz, node));
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  for (i = 0; i < ldim; i++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, scalar[i + ldim * node]);
        maxdata = MAX(maxdata, scalar[i + ldim * node]);
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tri minmax");

  RSS(ref_gather_node_tec_block(ref_node, nnode, l2c, ldim, scalar, dataformat,
                                file),
      "block points");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tri node");

  RSS(ref_gather_cell_id_tec(ref_node, ref_cell, id, ncell, l2c, REF_TRUE,
                             file),
      "c2n");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tri cell");

  ref_free(l2c);
  return REF_SUCCESS;
}